

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::StripComments::fodder(StripComments *this,Fodder *fodder)

{
  bool bVar1;
  iterator this_00;
  reference __x;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  FodderElement *f;
  iterator __end2;
  iterator __begin2;
  Fodder *__range2;
  Fodder copy;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [32];
  
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,in_RDI);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         *)0x2c83f7);
  local_30 = local_28;
  local_38._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin(in_stack_ffffffffffffffa8);
  this_00 = std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
          ::operator*(&local_38);
    if (__x->kind == LINE_END) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      push_back((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)this_00._M_current,__x);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(&local_38);
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this_00._M_current);
  return;
}

Assistant:

void fodder(Fodder &fodder)
    {
        Fodder copy = fodder;
        fodder.clear();
        for (auto &f : copy) {
            if (f.kind == FodderElement::LINE_END)
                fodder.push_back(f);
        }
    }